

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool google::protobuf::ExistingFileMatchesProto
               (Edition edition,FileDescriptor *existing_file,FileDescriptorProto *proto)

{
  int iVar1;
  bool bVar2;
  string_view value;
  FileDescriptorProto existing_proto;
  string local_158;
  string local_138;
  undefined1 local_118 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
  FileDescriptor::CopyTo(existing_file,(FileDescriptorProto *)local_118);
  if ((edition == EDITION_PROTO2) &&
     ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x4) !=
      (undefined1  [232])0x0)) {
    local_118[0x10] = local_118[0x10] | 4;
    if ((local_118._8_8_ & 1) != 0) {
      local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
    }
    value._M_str = "proto2";
    value._M_len = 6;
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(local_118 + 0xd8),value,(Arena *)local_118._8_8_);
  }
  MessageLite::SerializeAsString_abi_cxx11_(&local_158,(MessageLite *)local_118);
  MessageLite::SerializeAsString_abi_cxx11_(&local_138,(MessageLite *)proto);
  if (local_158._M_string_length == local_138._M_string_length) {
    if (local_158._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_158._M_dataplus._M_p,local_138._M_dataplus._M_p,local_158._M_string_length)
      ;
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  return bVar2;
}

Assistant:

PROTOBUF_NOINLINE static bool ExistingFileMatchesProto(
    Edition edition, const FileDescriptor* existing_file,
    const FileDescriptorProto& proto) {
  FileDescriptorProto existing_proto;
  existing_file->CopyTo(&existing_proto);
  if (edition == Edition::EDITION_PROTO2 && proto.has_syntax()) {
    existing_proto.set_syntax("proto2");
  }

  return existing_proto.SerializeAsString() == proto.SerializeAsString();
}